

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O3

RasterFormatInfo * rw::d3d::findFormatInfoD3D(uint32 d3dformat)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (*(uint32 *)((long)&formatInfoFull + lVar1) == d3dformat) {
      return (RasterFormatInfo *)((long)&formatInfoFull + lVar1);
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x2c0);
  return &findFormatInfoD3D::fake;
}

Assistant:

RasterFormatInfo*
findFormatInfoD3D(uint32 d3dformat)
{
	static RasterFormatInfo fake = { 0, 0, 0, 0 };
	int i;
	for(i = 0; i < (int)nelem(formatInfoFull); i++)
		if(formatInfoFull[i].d3dformat == d3dformat)
			return &formatInfoFull[i];
	return &fake;
}